

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

FileMetaData *
leveldb::FindSmallestBoundaryFile
          (InternalKeyComparator *icmp,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *level_files,
          InternalKey *largest_key)

{
  FileMetaData *pFVar1;
  int iVar2;
  FileMetaData *pFVar3;
  const_reference ppFVar4;
  bool bVar5;
  Slice local_60;
  Slice local_50;
  value_type local_40;
  FileMetaData *f;
  size_t i;
  FileMetaData *smallest_boundary_file;
  Comparator *user_cmp;
  InternalKey *largest_key_local;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *level_files_local;
  InternalKeyComparator *icmp_local;
  
  user_cmp = (Comparator *)largest_key;
  largest_key_local = (InternalKey *)level_files;
  level_files_local =
       (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)icmp;
  smallest_boundary_file = (FileMetaData *)InternalKeyComparator::user_comparator(icmp);
  i = 0;
  for (f = (FileMetaData *)0x0; pFVar1 = f,
      pFVar3 = (FileMetaData *)
               std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                         ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           *)largest_key_local), pFVar1 < pFVar3;
      f = (FileMetaData *)((long)&f->refs + 1)) {
    ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          *)largest_key_local,(size_type)f);
    local_40 = *ppFVar4;
    iVar2 = InternalKeyComparator::Compare
                      ((InternalKeyComparator *)level_files_local,&local_40->smallest,
                       (InternalKey *)user_cmp);
    pFVar1 = smallest_boundary_file;
    bVar5 = false;
    if (0 < iVar2) {
      local_50 = InternalKey::user_key(&local_40->smallest);
      local_60 = InternalKey::user_key((InternalKey *)user_cmp);
      iVar2 = (**(code **)(*(long *)pFVar1 + 0x10))(pFVar1,&local_50,&local_60);
      bVar5 = iVar2 == 0;
    }
    if ((bVar5) &&
       ((i == 0 ||
        (iVar2 = InternalKeyComparator::Compare
                           ((InternalKeyComparator *)level_files_local,&local_40->smallest,
                            (InternalKey *)(i + 0x18)), iVar2 < 0)))) {
      i = (size_t)local_40;
    }
  }
  return (FileMetaData *)i;
}

Assistant:

FileMetaData* FindSmallestBoundaryFile(
    const InternalKeyComparator& icmp,
    const std::vector<FileMetaData*>& level_files,
    const InternalKey& largest_key) {
  const Comparator* user_cmp = icmp.user_comparator();
  FileMetaData* smallest_boundary_file = nullptr;
  for (size_t i = 0; i < level_files.size(); ++i) {
    FileMetaData* f = level_files[i];
    if (icmp.Compare(f->smallest, largest_key) > 0 &&
        user_cmp->Compare(f->smallest.user_key(), largest_key.user_key()) ==
            0) {
      if (smallest_boundary_file == nullptr ||
          icmp.Compare(f->smallest, smallest_boundary_file->smallest) < 0) {
        smallest_boundary_file = f;
      }
    }
  }
  return smallest_boundary_file;
}